

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::ValueExtractor::extractImage(ValueExtractor *this,QIcon *icon,Alignment *a,QSize *size)

{
  Property PVar1;
  Declaration *pDVar2;
  DeclarationData *pDVar3;
  Alignment AVar4;
  QSize QVar5;
  void *__buf;
  bool bVar6;
  long lVar7;
  int i;
  ulong uVar8;
  long in_FS_OFFSET;
  QImageReader imageReader;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char16_t> local_58;
  QImageReader local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = 0;
  bVar6 = false;
  for (uVar8 = 0; uVar8 < (ulong)(this->declarations).d.size; uVar8 = uVar8 + 1) {
    pDVar2 = (this->declarations).d.ptr;
    PVar1 = (pDVar2[uVar8].d.d.ptr)->propertyId;
    if (PVar1 == QtImageAlignment) {
      AVar4 = Declaration::alignmentValue((Declaration *)((long)&(pDVar2->d).d.ptr + lVar7));
      (a->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).super_QFlagsStorage<Qt::AlignmentFlag>.i
           = (Int)AVar4;
      bVar6 = true;
    }
    else if (PVar1 == QtImage) {
      Declaration::iconValue((Declaration *)&local_58);
      QIcon::operator=(icon,(QIcon *)&local_58);
      QIcon::~QIcon((QIcon *)&local_58);
      pDVar3 = pDVar2[uVar8].d.d.ptr;
      bVar6 = true;
      if (((pDVar3->values).d.size != 0) && (((pDVar3->values).d.ptr)->type == Uri)) {
        local_40.d = (QImageReaderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toString();
        local_78.d = (Data *)0x0;
        local_78.ptr = (char *)0x0;
        local_78.size = 0;
        QImageReader::QImageReader(&local_40,(QString *)&local_58,(QByteArray *)&local_78);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QVar5 = QImageReader::size(&local_40);
        *size = QVar5;
        if (QVar5 == (QSize)0x0) {
          QImageReader::read((QImageReader *)&local_58,(int)&local_40,__buf,(size_t)size);
          QVar5 = QImage::size((QImage *)&local_58);
          *size = QVar5;
          QImage::~QImage((QImage *)&local_58);
        }
        QImageReader::~QImageReader(&local_40);
      }
    }
    lVar7 = lVar7 + 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool ValueExtractor::extractImage(QIcon *icon, Qt::Alignment *a, QSize *size)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case QtImage:
            *icon = decl.iconValue();
            if (decl.d->values.size() > 0 && decl.d->values.at(0).type == Value::Uri) {
                // try to pull just the size from the image...
                QImageReader imageReader(decl.d->values.at(0).variant.toString());
                if ((*size = imageReader.size()).isNull()) {
                    // but we'll have to load the whole image if the
                    // format doesn't support just reading the size
                    *size = imageReader.read().size();
                }
            }
            break;
        case QtImageAlignment: *a = decl.alignmentValue();  break;
        default: continue;
        }
        hit = true;
    }
    return hit;
}